

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_int,_void,_true>::rd_string
          (uintwide_t<32U,_unsigned_int,_void,_true> *this,char *str_input,unsigned_fast_type count,
          int base_hint)

{
  byte bVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  uint t;
  uint uVar5;
  uint8_t uc_oct;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  
  cVar3 = (char)base_hint;
  (this->values).super_array<unsigned_int,_1UL>.elems[0] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      count = 0;
    }
    else {
      uVar4 = 0;
      do {
        count = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = count;
      } while (str_input[lVar2] != '\0');
    }
  }
  uVar4 = 0;
  if (count != 0) {
    uVar4 = (ulong)(*str_input == '+');
  }
  bVar8 = false;
  if (count != 0) {
    bVar8 = *str_input == '-';
    uVar4 = uVar4 + bVar8;
  }
  if (((cVar3 == '\0') && (cVar3 = '\n', uVar4 < count)) && (str_input[uVar4] == '0')) {
    if ((byte)(str_input[uVar4 + 1] - 0x30U) < 9) {
      uVar4 = uVar4 + 1;
      cVar3 = '\b';
    }
    else if ((byte)(str_input[uVar4 + 1] | 0x20U) == 0x78) {
      uVar4 = uVar4 + 2;
      cVar3 = '\x10';
    }
  }
  bVar7 = true;
  if (uVar4 < count) {
    uVar5 = (this->values).super_array<unsigned_int,_1UL>.elems[0];
    do {
      bVar1 = str_input[uVar4];
      if (bVar1 != 0x27) {
        if (cVar3 == '\x10') {
          bVar6 = bVar1 - 0x30;
          bVar7 = (bVar6 < 10 || (byte)(bVar1 + 0xbf) < 6) || (byte)(bVar1 + 0x9f) < 6;
          if ((bVar6 < 10) ||
             ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar6 = bVar1 + 0xa9;
            }
            else if ((byte)(bVar1 + 0xbf) < 6) {
              bVar6 = bVar1 - 0x37;
            }
            else if (9 < bVar6) {
              bVar6 = 0;
            }
            uVar5 = uVar5 << 4;
LAB_0013bd2c:
            uVar5 = bVar6 | uVar5;
LAB_0013bd33:
            (this->values).super_array<unsigned_int,_1UL>.elems[0] = uVar5;
          }
        }
        else if (cVar3 == '\n') {
          bVar7 = (byte)(bVar1 - 0x30) < 10;
          if (bVar7) {
            uVar5 = (uint)(byte)(bVar1 - 0x30) + uVar5 * 10;
            goto LAB_0013bd33;
          }
        }
        else if (cVar3 == '\b') {
          bVar6 = bVar1 - 0x30;
          bVar7 = bVar6 < 9;
          if (bVar7) {
            uVar5 = uVar5 << 3;
            goto LAB_0013bd2c;
          }
        }
      }
    } while ((uVar4 + 1 < count) && (uVar4 = uVar4 + 1, bVar7 != false));
  }
  if (bVar8) {
    (this->values).super_array<unsigned_int,_1UL>.elems[0] =
         -(this->values).super_array<unsigned_int,_1UL>.elems[0];
  }
  return bVar7;
}

Assistant:

constexpr auto fill_unsafe(DestinationIterator first, DestinationIterator last, ValueType val) -> void
  {
    while(first != last)
    {
      using local_destination_value_type = typename iterator_detail::iterator_traits<DestinationIterator>::value_type;

      *first = static_cast<local_destination_value_type>(val);

      ++first;
    }
  }